

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

Address * cfd::core::ConfidentialTransaction::GetPegoutAddressFromDescriptor
                    (Address *__return_storage_ptr__,string *bitcoin_descriptor,
                    uint32_t bip32_counter,NetType net_type,NetType elements_net_type)

{
  ExtPubkey local_188;
  undefined1 local_111;
  undefined1 local_110 [8];
  ExtPubkey base_ext_pubkey;
  string local_98;
  byte local_75;
  byte local_62;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  ByteData prefix;
  NetType elements_net_type_local;
  NetType net_type_local;
  uint32_t bip32_counter_local;
  string *bitcoin_descriptor_local;
  Address *result;
  
  local_62 = 0;
  local_75 = 0;
  base_ext_pubkey.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  base_ext_pubkey.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  prefix.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = elements_net_type;
  if (net_type == kMainnet) {
    ::std::allocator<char>::allocator();
    local_62 = 1;
    ::std::__cxx11::string::string((string *)&local_60,"0488b21e",&local_61);
    local_75 = 1;
    ByteData::ByteData((ByteData *)local_40,&local_60);
  }
  else {
    ::std::allocator<char>::allocator();
    base_ext_pubkey.tweak_sum_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    ::std::__cxx11::string::string
              ((string *)&local_98,"043587cf",
               (allocator *)
               ((long)&base_ext_pubkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    base_ext_pubkey.tweak_sum_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
    ByteData::ByteData((ByteData *)local_40,&local_98);
  }
  if ((base_ext_pubkey.tweak_sum_.data_.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_98);
  }
  if ((base_ext_pubkey.tweak_sum_.data_.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
    ::std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&base_ext_pubkey.tweak_sum_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
  }
  if ((local_75 & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  if ((local_62 & 1) != 0) {
    ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  ExtPubkey::ExtPubkey((ExtPubkey *)local_110);
  local_111 = 0;
  core::Address::Address(__return_storage_ptr__);
  GenerateExtPubkeyFromDescriptor
            (&local_188,bitcoin_descriptor,bip32_counter,(ByteData *)local_40,net_type,
             prefix.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,(ExtPubkey *)local_110,
             __return_storage_ptr__);
  ExtPubkey::~ExtPubkey(&local_188);
  local_111 = 1;
  ExtPubkey::~ExtPubkey((ExtPubkey *)local_110);
  ByteData::~ByteData((ByteData *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Address ConfidentialTransaction::GetPegoutAddressFromDescriptor(
    const std::string &bitcoin_descriptor, uint32_t bip32_counter,
    NetType net_type, NetType elements_net_type) {
  auto prefix = (net_type == NetType::kMainnet) ? ByteData("0488b21e")
                                                : ByteData("043587cf");
  ExtPubkey base_ext_pubkey;
  Address result;
  GenerateExtPubkeyFromDescriptor(
      bitcoin_descriptor, bip32_counter, prefix, net_type, elements_net_type,
      &base_ext_pubkey, &result);
  return result;
}